

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool __thiscall
slang::CommandLine::parse
          (CommandLine *this,
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          args,ParseOptions options)

{
  string_view value_00;
  string_view name_00;
  string_view arg_00;
  string_view arg_01;
  string_view value_01;
  string_view name_01;
  string_view value_02;
  bool bVar1;
  runtime_error *prVar2;
  reference this_00;
  iterator pbVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference pvVar6;
  element_type *this_01;
  pointer ppVar7;
  pointer ppVar8;
  basic_string_view<char,_std::char_traits<char>_> *__source;
  undefined8 uVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  aVar10;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> sVar11;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  undefined1 auVar13 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  basic_string_view<char,_std::char_traits<char>_> local_9f8;
  basic_string_view<char> local_9e8;
  string local_9d8;
  basic_string_view<char,_std::char_traits<char>_> local_9b8;
  basic_string_view<char> local_9a8;
  string local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_978 [2];
  string local_968;
  Option *local_948;
  size_t local_940;
  undefined8 local_938;
  size_t local_930;
  undefined1 local_928 [8];
  string result_1;
  char *local_900;
  basic_string_view<char> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  undefined8 local_8c8;
  size_t sStack_8c0;
  undefined1 local_8b8 [8];
  string nearest;
  char *pcStack_890;
  basic_string_view<char> local_888;
  undefined1 local_878 [8];
  string error;
  Option *local_840;
  Option *option;
  string_view value;
  undefined1 local_818 [8];
  string_view name;
  bool longName;
  _Self local_7e0;
  allocator<char> local_7d1;
  key_type local_7d0;
  _Self local_7b0;
  iterator it_1;
  allocator<char> local_799;
  key_type local_798;
  _Self local_778;
  iterator it;
  char *local_768;
  basic_string_view<char,_std::char_traits<char>_> local_760;
  size_type local_750;
  size_t plusIndex;
  string_view ignoreArg;
  string local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6d8 [2];
  string local_6c8;
  size_t local_6a8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  local_6a0;
  size_t local_698;
  size_t local_690;
  undefined1 local_688 [8];
  string result;
  basic_string_view<char,_std::char_traits<char>_> arg;
  iterator __end1;
  iterator __begin1;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *__range1;
  undefined1 auStack_638 [4];
  int skip;
  string_view firstPositional;
  undefined1 auStack_620 [6];
  bool hadUnknowns;
  bool doubleDash;
  string_view expectingValName;
  Option *expectingVal;
  pointer local_600;
  path local_5f8;
  path local_5d0;
  string local_5a8;
  CommandLine *local_578;
  CommandLine *this_local;
  undefined1 auStack_568 [4];
  ParseOptions options_local;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  args_local;
  undefined1 local_530 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_520;
  char *local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_510;
  string *local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  char *pcStack_4f8;
  string *local_4f0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8;
  undefined1 local_4c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b0;
  char *local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a0;
  string *local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_490;
  char *pcStack_488;
  string *local_480;
  char *local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_470;
  char *local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_460;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_458;
  undefined1 local_430 [16];
  basic_string_view<char,_std::char_traits<char>_> *local_420;
  char *local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_410;
  string *local_408;
  basic_string_view<char,_std::char_traits<char>_> *local_400;
  char *pcStack_3f8;
  string *local_3f0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_3e8;
  undefined1 local_3c0 [16];
  basic_string_view<char,_std::char_traits<char>_> *local_3b0;
  char *local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a0;
  string *local_398;
  basic_string_view<char,_std::char_traits<char>_> *local_390;
  char *pcStack_388;
  string *local_380;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_378;
  undefined1 local_350 [16];
  basic_string_view<char,_std::char_traits<char>_> *local_340;
  char *local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  string *local_328;
  basic_string_view<char,_std::char_traits<char>_> *local_320;
  char *pcStack_318;
  string *local_310;
  undefined8 local_308;
  char *pcStack_300;
  undefined1 *local_2f8;
  basic_string_view<char> *local_2f0;
  size_t local_2e8;
  char *pcStack_2e0;
  basic_string_view<char,_std::char_traits<char>_> *local_2d8;
  basic_string_view<char> *local_2d0;
  size_t local_2c8;
  char *pcStack_2c0;
  basic_string_view<char,_std::char_traits<char>_> *local_2b8;
  basic_string_view<char> *local_2b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2a8 [3];
  undefined1 local_290 [16];
  v9 *local_280;
  char *local_278;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_270;
  v9 *local_268;
  char *pcStack_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  undefined8 local_250;
  char *local_248;
  undefined1 *local_240;
  basic_string_view<char> *local_238;
  char *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_228;
  char *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  char *pcStack_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  char *pcStack_1e0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d0;
  undefined1 *local_1c8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b8;
  undefined8 local_1b0;
  undefined1 *local_1a8;
  size_type *local_1a0;
  undefined1 *local_198;
  size_type *local_190;
  size_type *local_188;
  undefined8 local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  basic_string_view<char,_std::char_traits<char>_> **local_160;
  basic_string_view<char,_std::char_traits<char>_> **local_140;
  basic_string_view<char,_std::char_traits<char>_> **local_120;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_108;
  undefined1 *local_100;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_f8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_d8;
  undefined1 *local_d0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_c8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_a8;
  undefined1 *local_a0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_98;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_90;
  undefined8 local_88;
  undefined1 *local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  basic_string_view<char,_std::char_traits<char>_> *local_70;
  undefined1 *local_68;
  v9 **local_60;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_18;
  undefined1 *local_10;
  
  args_local.data_ = (pointer)args.size_;
  _auStack_568 = (Option *)args.data_;
  local_578 = this;
  this_local._4_4_ = options;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
          ::empty(&this->optionMap);
  if (bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"No options defined");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((uint)this_local._4_4_ & 0x100) == 0) {
    bVar1 = nonstd::span_lite::
            span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
            ::empty((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                     *)auStack_568);
    if (bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Expected at least one argument");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = nonstd::span_lite::
              span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
              ::operator[]((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                            *)auStack_568,0);
    std::filesystem::__cxx11::
    u8path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path,char>
              (&local_5f8,(__cxx11 *)this_00,__source);
    std::filesystem::__cxx11::path::filename(&local_5d0,&local_5f8);
    std::filesystem::__cxx11::path::u8string(&local_5a8,&local_5d0);
    std::__cxx11::string::operator=((string *)&this->programName,(string *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::filesystem::__cxx11::path::~path(&local_5d0);
    std::filesystem::__cxx11::path::~path(&local_5f8);
    sVar11 = nonstd::span_lite::
             span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
             ::subspan((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                        *)auStack_568,1,0xffffffffffffffff);
    expectingVal = (Option *)sVar11.data_;
    _auStack_568 = expectingVal;
    local_600 = (pointer)sVar11.size_;
    args_local.data_ = local_600;
  }
  expectingValName._M_str = (char *)0x0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_620);
  firstPositional._M_str._7_1_ = 0;
  firstPositional._M_str._6_1_ = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_638);
  __range1._4_4_ = 0;
  __end1 = nonstd::span_lite::
           span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
           ::begin((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                    *)auStack_568);
  pbVar3 = nonstd::span_lite::
           span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
           ::end((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                  *)auStack_568);
  do {
    if (__end1 == pbVar3) {
      if (expectingValName._M_str != (char *)0x0) {
        local_9b8 = sv("{}: no value provided for argument \'{}\'",0x27);
        local_2d0 = &local_9a8;
        local_2d8 = &local_9b8;
        local_2e8 = local_9b8._M_len;
        pcStack_2e0 = local_9b8._M_str;
        ::fmt::v9::basic_string_view<char>::
        basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
                  (local_2d0,local_9b8);
        local_70 = local_2d8;
        local_398 = &this->programName;
        local_390 = (basic_string_view<char,_std::char_traits<char>_> *)local_9a8.data_;
        pcStack_388 = (char *)local_9a8.size_;
        local_3a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_620
        ;
        local_140 = &local_390;
        local_3b0 = (basic_string_view<char,_std::char_traits<char>_> *)local_9a8.data_;
        local_3a8 = (char *)local_9a8.size_;
        local_380 = &local_998;
        ::fmt::v9::
        make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>&>
                  (&local_3e8,(v9 *)local_398,local_3a0,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_9a8.data_);
        local_d0 = local_3c0;
        local_b8 = 0xdd;
        fmt_03.size_ = 0xdd;
        fmt_03.data_ = local_3a8;
        args_04.field_1.values_ = in_R9.values_;
        args_04.desc_ = (unsigned_long_long)&local_3e8;
        local_d8 = &local_3e8;
        local_c8 = &local_3e8;
        local_c0 = &local_3e8;
        local_b0 = local_d0;
        ::fmt::v9::vformat_abi_cxx11_(&local_998,(v9 *)local_3b0,fmt_03,args_04);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->errors,&local_998);
        std::__cxx11::string::~string((string *)&local_998);
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
      if (((!bVar1) &&
          (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_638),
          !bVar1)) && ((firstPositional._M_str._6_1_ & 1) == 0)) {
        local_9f8 = sv("{}: positional arguments are not allowed (see e.g. \'{}\')",0x38);
        local_2b0 = &local_9e8;
        local_2b8 = &local_9f8;
        local_2c8 = local_9f8._M_len;
        pcStack_2c0 = local_9f8._M_str;
        ::fmt::v9::basic_string_view<char>::
        basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
                  (local_2b0,local_9f8);
        local_78 = local_2b8;
        local_408 = &this->programName;
        local_400 = (basic_string_view<char,_std::char_traits<char>_> *)local_9e8.data_;
        pcStack_3f8 = (char *)local_9e8.size_;
        local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_638
        ;
        local_120 = &local_400;
        local_420 = (basic_string_view<char,_std::char_traits<char>_> *)local_9e8.data_;
        local_418 = (char *)local_9e8.size_;
        local_3f0 = &local_9d8;
        ::fmt::v9::
        make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>&>
                  (&local_458,(v9 *)local_408,local_410,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_9e8.data_);
        local_a0 = local_430;
        local_88 = 0xdd;
        fmt_04.size_ = 0xdd;
        fmt_04.data_ = local_418;
        args_05.field_1.values_ = in_R9.values_;
        args_05.desc_ = (unsigned_long_long)&local_458;
        local_a8 = &local_458;
        local_98 = &local_458;
        local_90 = &local_458;
        local_80 = local_a0;
        ::fmt::v9::vformat_abi_cxx11_(&local_9d8,(v9 *)local_420,fmt_04,args_05);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->errors,&local_9d8);
        std::__cxx11::string::~string((string *)&local_9d8);
      }
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->errors);
      return bVar1;
    }
    result.field_2._8_8_ = __end1->_M_len;
    aVar10 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
              )__end1->_M_str;
    value_02._M_len = __end1->_M_len;
    value_02._M_str = __end1->_M_str;
    if (__range1._4_4_ == 0) {
      if (expectingValName._M_str == (char *)0x0) {
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::length
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           ((long)&result.field_2 + 8));
        if (((sVar5 < 2) || ((firstPositional._M_str._7_1_ & 1) != 0)) ||
           ((pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 ((long)&result.field_2 + 8),0), *pvVar6 != '-' &&
            (pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 ((long)&result.field_2 + 8),0), *pvVar6 != '+')))) {
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_638);
          if (bVar1) {
            _auStack_638 = result.field_2._8_8_;
            firstPositional._M_len = (size_t)aVar10;
          }
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
          if (bVar1) {
            this_01 = std::
                      __shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)this);
            bVar12 = sv("",0);
            value_01._M_str = (char *)aVar10.values_;
            value_01._M_len = result.field_2._8_8_;
            Option::set_abi_cxx11_(&local_6f8,this_01,bVar12,value_01,(bool)(this_local._7_1_ & 1));
            std::__cxx11::string::~string((string *)&local_6f8);
            in_R9 = aVar10;
          }
        }
        else {
          uVar9 = result.field_2._8_8_;
          join_0x00000010_0x00000000_ = sv("--",2);
          bVar12._M_str = (char *)aVar10.values_;
          bVar12._M_len = uVar9;
          bVar1 = std::operator==(bVar12,join_0x00000010_0x00000000_);
          if (bVar1) {
            firstPositional._M_str._7_1_ = 1;
          }
          else {
            bVar1 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::empty(&this->cmdIgnore);
            if (!bVar1) {
              plusIndex = result.field_2._8_8_;
              ignoreArg._M_len = (size_t)aVar10;
              pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 ((basic_string_view<char,_std::char_traits<char>_> *)
                                  ((long)&result.field_2 + 8),0);
              if (*pvVar6 == '+') {
                local_760 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       ((long)&result.field_2 + 8),1,0xffffffffffffffff);
                local_750 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                      (&local_760,'+',0);
                if (local_750 != 0xffffffffffffffff) {
                  _it = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   ((long)&result.field_2 + 8),0,local_750 + 1);
                  plusIndex = (size_t)it._M_node;
                  ignoreArg._M_len = (size_t)local_768;
                }
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&local_798,
                         (basic_string_view<char,_std::char_traits<char>_> *)&plusIndex,&local_799);
              local_778._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::find(&this->cmdIgnore,&local_798);
              std::__cxx11::string::~string((string *)&local_798);
              std::allocator<char>::~allocator(&local_799);
              it_1._M_node = (_Base_ptr)
                             std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             ::end(&this->cmdIgnore);
              bVar1 = std::operator!=(&local_778,(_Self *)&it_1);
              if (bVar1) {
                ppVar7 = std::
                         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                         ::operator->(&local_778);
                __range1._4_4_ = ppVar7->second;
                goto LAB_0028d761;
              }
            }
            bVar1 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::empty(&this->cmdRename);
            auVar13._8_8_ = aVar10.values_;
            auVar13._0_8_ = result.field_2._8_8_;
            if (!bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&local_7d0,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         ((long)&result.field_2 + 8),&local_7d1);
              local_7b0._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&this->cmdRename,&local_7d0);
              std::__cxx11::string::~string((string *)&local_7d0);
              std::allocator<char>::~allocator(&local_7d1);
              local_7e0._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end(&this->cmdRename);
              bVar1 = std::operator!=(&local_7b0,&local_7e0);
              auVar13._0_8_ = result.field_2._8_8_;
              if (bVar1) {
                ppVar8 = std::
                         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator->(&local_7b0);
                auVar13 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)&ppVar8->second);
              }
            }
            arg._M_len = auVar13._8_8_;
            result.field_2._8_8_ = auVar13._0_8_;
            pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)
                                ((long)&result.field_2 + 8),0);
            if (*pvVar6 == '+') {
              name._M_str._4_4_ = this_local._4_4_;
              arg_01._M_str = (char *)arg._M_len;
              arg_01._M_len = result.field_2._8_8_;
              handlePlusArg(this,arg_01,this_local._4_4_,(bool *)((long)&firstPositional._M_str + 6)
                           );
            }
            else {
              name._M_str._3_1_ = 0;
              _local_818 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                     ((basic_string_view<char,_std::char_traits<char>_> *)
                                      ((long)&result.field_2 + 8),1,0xffffffffffffffff);
              pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 ((basic_string_view<char,_std::char_traits<char>_> *)local_818,0);
              if (*pvVar6 == '-') {
                name._M_str._3_1_ = 1;
                join_0x00000010_0x00000000_ =
                     std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_818,1,
                                0xffffffffffffffff);
                _local_818 = join_0x00000010_0x00000000_;
              }
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&option);
              local_840 = findOption(this,_local_818,(string_view *)&option);
              if ((local_840 == (Option *)0x0) && ((name._M_str._3_1_ & 1) == 0)) {
                error.field_2._12_1_ = this_local._4_1_;
                error.field_2._13_1_ = this_local._5_1_;
                error.field_2._14_1_ = this_local._6_1_;
                error.field_2._15_1_ = this_local._7_1_;
                local_840 = tryGroupOrPrefix(this,(string_view *)local_818,(string_view *)&option,
                                             this_local._4_4_);
                if (local_840 != (Option *)0x0) {
                  result.field_2._8_8_ = local_818;
                  arg._M_len = name._M_len;
                }
              }
              if (local_840 == (Option *)0x0) {
                join_0x00000010_0x00000000_ = sv("{}: unknown command line argument \'{}\'",0x26);
                local_2f0 = &local_888;
                local_2f8 = (undefined1 *)((long)&nearest.field_2 + 8);
                local_308 = nearest.field_2._8_8_;
                pcStack_300 = pcStack_890;
                ::fmt::v9::basic_string_view<char>::
                basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
                          (local_2f0,join_0x00000010_0x00000000_);
                local_68 = local_2f8;
                local_328 = &this->programName;
                local_320 = (basic_string_view<char,_std::char_traits<char>_> *)local_888.data_;
                pcStack_318 = (char *)local_888.size_;
                local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&result.field_2 + 8);
                local_160 = &local_320;
                local_340 = (basic_string_view<char,_std::char_traits<char>_> *)local_888.data_;
                local_338 = (char *)local_888.size_;
                local_310 = (string *)local_878;
                ::fmt::v9::
                make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>&>
                          (&local_378,(v9 *)local_328,local_330,
                           (basic_string_view<char,_std::char_traits<char>_> *)local_888.data_);
                local_100 = local_350;
                local_e8 = 0xdd;
                fmt_00.size_ = 0xdd;
                fmt_00.data_ = local_338;
                args_01.field_1.values_ = in_R9.values_;
                args_01.desc_ = (unsigned_long_long)&local_378;
                local_108 = &local_378;
                local_f8 = &local_378;
                local_f0 = &local_378;
                local_e0 = local_100;
                ::fmt::v9::vformat_abi_cxx11_((string *)local_878,(v9 *)local_340,fmt_00,args_01);
                local_8c8 = result.field_2._8_8_;
                sStack_8c0 = arg._M_len;
                arg_00._M_str = (char *)arg._M_len;
                arg_00._M_len = result.field_2._8_8_;
                findNearestMatch_abi_cxx11_((string *)local_8b8,this,arg_00);
                uVar4 = std::__cxx11::string::empty();
                if ((uVar4 & 1) == 0) {
                  join_0x00000010_0x00000000_ = sv(", did you mean \'{}\'?",0x14);
                  local_238 = &local_8f8;
                  local_240 = (undefined1 *)((long)&result_1.field_2 + 8);
                  local_250 = result_1.field_2._8_8_;
                  local_248 = local_900;
                  uVar9 = result_1.field_2._8_8_;
                  ::fmt::v9::basic_string_view<char>::
                  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
                            (local_238,join_0x00000010_0x00000000_);
                  local_10 = local_240;
                  local_258 = &local_8e8;
                  local_268 = (v9 *)local_8f8.data_;
                  pcStack_260 = (char *)local_8f8.size_;
                  local_270 = (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_8b8;
                  local_60 = &local_268;
                  local_280 = (v9 *)local_8f8.data_;
                  local_278 = (char *)local_8f8.size_;
                  local_2a8[0] = ::fmt::v9::
                                 make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&>
                                           (local_270,(v9 *)uVar9,local_258);
                  local_38 = local_290;
                  local_40 = local_2a8;
                  local_28 = 0xd;
                  fmt_01.size_ = 0xd;
                  fmt_01.data_ = local_278;
                  args_02.field_1.values_ = in_R9.values_;
                  args_02.desc_ = (unsigned_long_long)local_40;
                  local_30 = local_40;
                  local_20 = local_38;
                  local_18 = local_40;
                  ::fmt::v9::vformat_abi_cxx11_(&local_8e8,local_280,fmt_01,args_02);
                  std::__cxx11::string::operator+=((string *)local_878,(string *)&local_8e8);
                  std::__cxx11::string::~string((string *)&local_8e8);
                }
                firstPositional._M_str._6_1_ = 1;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &this->errors,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_878);
                std::__cxx11::string::~string((string *)local_8b8);
                std::__cxx11::string::~string((string *)local_878);
              }
              else {
                bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&option);
                if ((bVar1) && (bVar1 = Option::expectsValue(local_840), bVar1)) {
                  expectingValName._M_str = (char *)local_840;
                  _auStack_620 = result.field_2._8_8_;
                  expectingValName._M_len = arg._M_len;
                }
                else {
                  local_938 = result.field_2._8_8_;
                  local_930 = arg._M_len;
                  local_948 = option;
                  local_940 = value._M_len;
                  name_00._M_str = (char *)arg._M_len;
                  name_00._M_len = result.field_2._8_8_;
                  value_00._M_str = (char *)value._M_len;
                  value_00._M_len = (size_t)option;
                  in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                           )value._M_len;
                  Option::set_abi_cxx11_
                            ((string *)local_928,local_840,name_00,value_00,
                             (bool)(this_local._7_1_ & 1));
                  uVar4 = std::__cxx11::string::empty();
                  if ((uVar4 & 1) == 0) {
                    local_460 = local_978;
                    local_468 = "{}: {}";
                    local_230 = "{}: {}";
                    local_978[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x6e01f0;
                    local_228 = local_460;
                    local_518 = (char *)std::char_traits<char>::length("{}: {}");
                    local_170 = local_468;
                    local_508 = &this->programName;
                    local_4f0 = &local_968;
                    local_500 = local_978[0];
                    local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_928;
                    local_1f0 = &local_500;
                    local_520 = local_978[0];
                    pcStack_4f8 = local_518;
                    local_1e8 = local_520;
                    pcStack_1e0 = local_518;
                    ::fmt::v9::
                    make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,std::__cxx11::string&>
                              ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&args_local.size_,(v9 *)local_508,local_510,local_978[0]);
                    local_198 = local_530;
                    local_1a0 = &args_local.size_;
                    local_180 = 0xdd;
                    fmt_02.size_ = 0xdd;
                    fmt_02.data_ = local_518;
                    args_03.field_1.values_ = in_R9.values_;
                    args_03.desc_ = (unsigned_long_long)local_1a0;
                    local_190 = local_1a0;
                    local_188 = local_1a0;
                    local_178 = local_198;
                    ::fmt::v9::vformat_abi_cxx11_(&local_968,(v9 *)local_520,fmt_02,args_03);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &this->errors,&local_968);
                    std::__cxx11::string::~string((string *)&local_968);
                  }
                  std::__cxx11::string::~string((string *)local_928);
                }
              }
            }
          }
        }
      }
      else {
        local_698 = _auStack_620;
        local_690 = expectingValName._M_len;
        name_01._M_str = (char *)expectingValName._M_len;
        name_01._M_len = _auStack_620;
        local_6a8 = result.field_2._8_8_;
        local_6a0 = aVar10;
        Option::set_abi_cxx11_
                  ((string *)local_688,(Option *)expectingValName._M_str,name_01,value_02,
                   (bool)(this_local._7_1_ & 1));
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          local_470 = local_6d8;
          local_478 = "{}: {}";
          local_220 = "{}: {}";
          local_6d8[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x6e01f0;
          local_218 = local_470;
          local_4a8 = (char *)std::char_traits<char>::length("{}: {}");
          local_168 = local_478;
          local_498 = &this->programName;
          local_480 = &local_6c8;
          local_490 = local_6d8[0];
          local_4a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688
          ;
          local_210 = &local_490;
          local_4b0 = local_6d8[0];
          pcStack_488 = local_4a8;
          local_208 = local_4b0;
          pcStack_200 = local_4a8;
          ::fmt::v9::
          make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,std::__cxx11::string&>
                    (&local_4e8,(v9 *)local_498,local_4a0,local_6d8[0]);
          local_1c8 = local_4c0;
          local_1d0 = &local_4e8;
          local_1b0 = 0xdd;
          fmt.size_ = 0xdd;
          fmt.data_ = local_4a8;
          args_00.field_1.values_ = aVar10.values_;
          args_00.desc_ = (unsigned_long_long)local_1d0;
          local_1c0 = local_1d0;
          local_1b8 = local_1d0;
          local_1a8 = local_1c8;
          ::fmt::v9::vformat_abi_cxx11_(&local_6c8,(v9 *)local_4b0,fmt,args_00);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->errors,&local_6c8);
          std::__cxx11::string::~string((string *)&local_6c8);
        }
        expectingValName._M_str = (char *)0x0;
        std::__cxx11::string::~string((string *)local_688);
        in_R9 = aVar10;
      }
    }
    else {
      __range1._4_4_ = __range1._4_4_ + -1;
    }
LAB_0028d761:
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

bool CommandLine::parse(span<const string_view> args, ParseOptions options) {
    if (optionMap.empty())
        throw std::runtime_error("No options defined");

    if (!options.ignoreProgramName) {
        if (args.empty())
            throw std::runtime_error("Expected at least one argument");

        programName = fs::path(fs::u8path(args[0])).filename().u8string();
        args = args.subspan(1);
    }

    Option* expectingVal = nullptr;
    string_view expectingValName;
    bool doubleDash = false;
    bool hadUnknowns = false;
    string_view firstPositional;

    int skip = 0;
    for (auto arg : args) {
        // Skip N arguments if needed (set by the cmdIgnore feature)
        if (skip) {
            skip--;
            continue;
        }

        // If we were previously expecting a value, set that now.
        if (expectingVal) {
            std::string result = expectingVal->set(expectingValName, arg, options.ignoreDuplicates);
            if (!result.empty())
                errors.emplace_back(fmt::format("{}: {}", programName, result));

            expectingVal = nullptr;
            continue;
        }

        // This is a positional argument if:
        // - Doesn't start with '-' and '+'
        // - Is exactly '-'
        // - Or we've seen a double dash already
        if (arg.length() <= 1 || doubleDash || (arg[0] != '-' && arg[0] != '+')) {
            if (firstPositional.empty())
                firstPositional = arg;

            if (positional)
                positional->set(""sv, arg, options.ignoreDuplicates);

            continue;
        }

        // Double dash indicates that all further arguments are positional.
        if (arg == "--"sv) {
            doubleDash = true;
            continue;
        }

        // Check if arg is in the list of commands to skip.
        if (!cmdIgnore.empty()) {
            // If we ignore a vendor command of the form +xx ,
            // we match on any +xx+yyy command as +yy is the command's argument.
            string_view ignoreArg = arg;
            if (arg[0] == '+') {
                size_t plusIndex = arg.substr(1).find_first_of('+');
                if (plusIndex != string_view::npos) {
                    ignoreArg = arg.substr(0, plusIndex +
                                                  1); // +1 because we started from arg.substr(1)
                }
            }

            if (auto it = cmdIgnore.find(std::string(ignoreArg)); it != cmdIgnore.end()) {
                // if yes, find how many args to skip
                skip = it->second;
                continue;
            }
        }

        // Check if arg is in the list of commands to translate.
        if (!cmdRename.empty()) {
            if (auto it = cmdRename.find(std::string(arg)); it != cmdRename.end()) {
                // if yes, rename argument
                arg = it->second;
            }
        }

        // Handle plus args, which are treated differently from all others.
        if (arg[0] == '+') {
            handlePlusArg(arg, options, hadUnknowns);
            continue;
        }

        // Get the raw name without leading dashes.
        bool longName = false;
        string_view name = arg.substr(1);
        if (name[0] == '-') {
            longName = true;
            name = name.substr(1);
        }

        string_view value;
        auto option = findOption(name, value);

        // If we didn't find the option and there was only a single dash,
        // maybe this was actually a group of single-char options or a prefixed value.
        if (!option && !longName) {
            option = tryGroupOrPrefix(name, value, options);
            if (option)
                arg = name;
        }

        // If we still didn't find it, that's an error.
        if (!option) {
            // Try to find something close to give a better error message.
            auto error = fmt::format("{}: unknown command line argument '{}'"sv, programName, arg);
            auto nearest = findNearestMatch(arg);
            if (!nearest.empty())
                error += fmt::format(", did you mean '{}'?"sv, nearest);

            hadUnknowns = true;
            errors.emplace_back(std::move(error));
            continue;
        }

        // Otherwise, we found what we wanted. If we have a value already, go ahead
        // and set it. Otherwise if we're expecting a value, assume that it will come
        // in the next argument.
        if (value.empty() && option->expectsValue()) {
            expectingVal = option;
            expectingValName = arg;
        }
        else {
            std::string result = option->set(arg, value, options.ignoreDuplicates);
            if (!result.empty())
                errors.emplace_back(fmt::format("{}: {}", programName, result));
        }
    }

    if (expectingVal) {
        errors.emplace_back(fmt::format("{}: no value provided for argument '{}'"sv, programName,
                                        expectingValName));
    }

    if (!positional && !firstPositional.empty() && !hadUnknowns) {
        errors.emplace_back(
            fmt::format("{}: positional arguments are not allowed (see e.g. '{}')"sv, programName,
                        firstPositional));
    }

    return errors.empty();
}